

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::NetStateRule::InternalSerializeWithCachedSizesToArray
          (NetStateRule *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  char *pcVar2;
  Type *pTVar3;
  UnknownFieldSet *unknown_fields;
  uint8 *puVar4;
  int iVar5;
  int iVar6;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar7;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(1,this->phase_,target);
  }
  if ((uVar1 & 2) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (2,this->min_level_,target);
  }
  if ((uVar1 & 4) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (3,this->max_level_,target);
  }
  iVar6 = (this->stage_).super_RepeatedPtrFieldBase.current_size_;
  iVar5 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  pRVar7 = &this->stage_;
  for (; iVar6 != iVar5; iVar5 = iVar5 + 1) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar7->super_RepeatedPtrFieldBase,iVar5);
    pcVar2 = (pTVar3->_M_dataplus)._M_p;
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar7->super_RepeatedPtrFieldBase,iVar5);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar2,(int)pTVar3->_M_string_length,SERIALIZE,"caffe.NetStateRule.stage");
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar7->super_RepeatedPtrFieldBase,iVar5);
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray(4,pTVar3,target);
  }
  iVar6 = (this->not_stage_).super_RepeatedPtrFieldBase.current_size_;
  iVar5 = 0;
  if (iVar6 < 1) {
    iVar6 = iVar5;
  }
  pRVar7 = &this->not_stage_;
  for (; iVar6 != iVar5; iVar5 = iVar5 + 1) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar7->super_RepeatedPtrFieldBase,iVar5);
    pcVar2 = (pTVar3->_M_dataplus)._M_p;
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar7->super_RepeatedPtrFieldBase,iVar5);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar2,(int)pTVar3->_M_string_length,SERIALIZE,"caffe.NetStateRule.not_stage");
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar7->super_RepeatedPtrFieldBase,iVar5);
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray(5,pTVar3,target);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return target;
  }
  unknown_fields = NetStateRule::unknown_fields(this);
  puVar4 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,target);
  return puVar4;
}

Assistant:

::google::protobuf::uint8* NetStateRule::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.NetStateRule)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .caffe.Phase phase = 1;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->phase(), target);
  }

  // optional int32 min_level = 2;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->min_level(), target);
  }

  // optional int32 max_level = 3;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->max_level(), target);
  }

  // repeated string stage = 4;
  for (int i = 0, n = this->stage_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->stage(i).data(), this->stage(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetStateRule.stage");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(4, this->stage(i), target);
  }

  // repeated string not_stage = 5;
  for (int i = 0, n = this->not_stage_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->not_stage(i).data(), this->not_stage(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.NetStateRule.not_stage");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(5, this->not_stage(i), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.NetStateRule)
  return target;
}